

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O1

float __thiscall Rml::Box::GetCumulativeEdge(Box *this,BoxArea area,BoxEdge edge)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  
  if ((area == Auto) &&
     (bVar2 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                     ,0x59), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if ((int)area < 0) {
    fVar5 = 0.0;
  }
  else {
    uVar3 = 2;
    if ((int)area < 2) {
      uVar3 = (ulong)area;
    }
    fVar5 = 0.0;
    lVar4 = 0;
    do {
      fVar5 = fVar5 + *(float *)((long)this->area_edges[0] + lVar4 + (long)(int)edge * 4);
      lVar4 = lVar4 + 0x10;
    } while (uVar3 * 0x10 + 0x10 != lVar4);
  }
  return fVar5;
}

Assistant:

float Box::GetCumulativeEdge(BoxArea area, BoxEdge edge) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	float size = 0;
	int max_area = Math::Min((int)area, (int)BoxArea::Padding);
	for (int i = 0; i <= max_area; i++)
		size += area_edges[i][(int)edge];

	return size;
}